

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aho-corasick-lite.cpp
# Opt level: O0

bool __thiscall Trie::loadDict(Trie *this,char *filePath)

{
  byte bVar1;
  ostream *this_00;
  istream *this_01;
  undefined8 in_RSI;
  long in_RDI;
  Unicode _unicode;
  uint32_t w;
  string line;
  ifstream ifs;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *in_stack_fffffffffffffd58;
  string *in_stack_fffffffffffffd60;
  undefined7 in_stack_fffffffffffffd70;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_270;
  uint local_254;
  string local_250 [16];
  Unicode *in_stack_fffffffffffffdc0;
  Trie *in_stack_fffffffffffffdc8;
  long local_220 [67];
  byte local_1;
  
  std::ifstream::ifstream(local_220,in_RSI,8);
  bVar1 = std::ios::operator!((ios *)((long)local_220 + *(long *)(local_220[0] + -0x18)));
  if ((bVar1 & 1) == 0) {
    std::__cxx11::string::string(local_250);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x116153);
    while( true ) {
      bVar1 = std::ios::eof();
      if (((bVar1 ^ 0xff) & 1) == 0) break;
      this_01 = std::operator>>((istream *)local_220,local_250);
      std::istream::operator>>(this_01,&local_254);
      CppJieba::TransCode::decode(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 CONCAT17(bVar1,in_stack_fffffffffffffd70),(value_type_conflict2 *)this_01);
      in_stack_fffffffffffffd60 = (string *)(in_RDI + 0x20);
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(&local_270);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffd60,
                 (value_type_conflict *)in_stack_fffffffffffffd58);
      insert(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
      std::istream::ignore((long)local_220,0x40);
    }
    std::ifstream::close();
    local_1 = 1;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
               CONCAT17(bVar1,in_stack_fffffffffffffd70));
    std::__cxx11::string::~string(local_250);
  }
  else {
    this_00 = std::operator<<((ostream *)&std::cout,"faild to load Dict file");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    local_1 = 0;
  }
  std::ifstream::~ifstream(local_220);
  return (bool)(local_1 & 1);
}

Assistant:

bool Trie::loadDict(const char *filePath)
{
	ifstream ifs(filePath);
	if ( ! ifs ) {
		cout << "faild to load Dict file" << endl;
		return false;
	}
	string line;
	uint32_t w;
    Unicode _unicode;
	while ( !ifs.eof()) {
		ifs >> line >> w;
	    decode(line, _unicode);
        weightVect.push_back(w);
		lengthVect.push_back(_unicode.size());
		insert(_unicode);
		ifs.ignore(64, '\n');
	}
	ifs.close();
	return true;
}